

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShellIntrinsics.cpp
# Opt level: O2

IntrinsicResult intrinsic_keyAvailable(Context *context,IntrinsicResult partialResult)

{
  Value local_20;
  
  MiniScript::KeyAvailable();
  MiniScript::IntrinsicResult::IntrinsicResult((IntrinsicResult *)context,&local_20,true);
  MiniScript::Value::~Value(&local_20);
  return (IntrinsicResult)(IntrinsicResultStorage *)context;
}

Assistant:

static IntrinsicResult intrinsic_keyAvailable(Context *context, IntrinsicResult partialResult) {
	return IntrinsicResult(KeyAvailable());
}